

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

void test_server_init(void)

{
  byte bVar1;
  int iVar2;
  cio_http_server *server_00;
  cio_eventloop *loop;
  cio_error cVar3;
  cio_inet_address *arg1;
  long lVar4;
  uint64_t auStack_5f4 [9];
  byte abStack_5ac [4];
  server_init_arguments server_init_arguments [11];
  cio_http_server_configuration local_238;
  cio_http_server server;
  
  server_init_arguments[0].server = &server;
  server_init_arguments[0].loop = &::loop;
  server_init_arguments[0].serve_error = serve_error;
  server_init_arguments[0].header_read_timeout = 5000000000;
  server_init_arguments[0].body_read_timeout = 5000000000;
  server_init_arguments[0].response_timeout = 5000000000;
  server_init_arguments[0].alloc_client = alloc_dummy_client;
  server_init_arguments[0].free_client = free_dummy_client;
  server_init_arguments[0].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[0].enable_fast_open = false;
  server_init_arguments[0].expected_result = CIO_SUCCESS;
  server_init_arguments[1].server = &server;
  server_init_arguments[1].loop = &::loop;
  server_init_arguments[1].serve_error = serve_error;
  server_init_arguments[1].header_read_timeout = 5000000000;
  server_init_arguments[1].body_read_timeout = 5000000000;
  server_init_arguments[1].response_timeout = 5000000000;
  server_init_arguments[1].alloc_client = alloc_dummy_client;
  server_init_arguments[1].free_client = free_dummy_client;
  server_init_arguments[1].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[1].enable_fast_open = true;
  server_init_arguments[1].expected_result = CIO_SUCCESS;
  server_init_arguments[2].server = (cio_http_server *)0x0;
  server_init_arguments[2].loop = &::loop;
  server_init_arguments[2].serve_error = serve_error;
  server_init_arguments[2].header_read_timeout = 5000000000;
  server_init_arguments[2].body_read_timeout = 5000000000;
  server_init_arguments[2].response_timeout = 5000000000;
  server_init_arguments[2].alloc_client = alloc_dummy_client;
  server_init_arguments[2].free_client = free_dummy_client;
  server_init_arguments[2].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[2].enable_fast_open = false;
  server_init_arguments[2].expected_result = CIO_INVALID_ARGUMENT;
  server_init_arguments[3].server = &server;
  server_init_arguments[3].loop = (cio_eventloop *)0x0;
  server_init_arguments[3].serve_error = serve_error;
  server_init_arguments[3].header_read_timeout = 5000000000;
  server_init_arguments[3].body_read_timeout = 5000000000;
  server_init_arguments[3].response_timeout = 5000000000;
  server_init_arguments[3].alloc_client = alloc_dummy_client;
  server_init_arguments[3].free_client = free_dummy_client;
  server_init_arguments[3].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[3].enable_fast_open = false;
  server_init_arguments[3].expected_result = CIO_INVALID_ARGUMENT;
  server_init_arguments[4].server = &server;
  server_init_arguments[4].loop = &::loop;
  server_init_arguments[4].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x0;
  server_init_arguments[4].header_read_timeout = 5000000000;
  server_init_arguments[4].body_read_timeout = 5000000000;
  server_init_arguments[4].response_timeout = 5000000000;
  server_init_arguments[4].alloc_client = alloc_dummy_client;
  server_init_arguments[4].free_client = free_dummy_client;
  server_init_arguments[4].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[4].enable_fast_open = false;
  server_init_arguments[4].expected_result = CIO_SUCCESS;
  server_init_arguments[5].server = &server;
  server_init_arguments[5].loop = &::loop;
  server_init_arguments[5].serve_error = serve_error;
  server_init_arguments[5].header_read_timeout = 0;
  server_init_arguments[5].body_read_timeout = 5000000000;
  server_init_arguments[5].response_timeout = 5000000000;
  server_init_arguments[5].alloc_client = alloc_dummy_client;
  server_init_arguments[5].free_client = free_dummy_client;
  server_init_arguments[5].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[5].enable_fast_open = false;
  server_init_arguments[5].expected_result = CIO_INVALID_ARGUMENT;
  server_init_arguments[6].server = &server;
  server_init_arguments[6].loop = &::loop;
  server_init_arguments[6].serve_error = serve_error;
  server_init_arguments[6].header_read_timeout = 5000000000;
  server_init_arguments[6].body_read_timeout = 0;
  server_init_arguments[6].response_timeout = 5000000000;
  server_init_arguments[6].alloc_client = alloc_dummy_client;
  server_init_arguments[6].free_client = free_dummy_client;
  server_init_arguments[6].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[6].enable_fast_open = false;
  server_init_arguments[6].expected_result = CIO_INVALID_ARGUMENT;
  server_init_arguments[7].server = &server;
  server_init_arguments[7].loop = &::loop;
  server_init_arguments[7].serve_error = serve_error;
  server_init_arguments[7].header_read_timeout = 5000000000;
  server_init_arguments[7].body_read_timeout = 5000000000;
  server_init_arguments[7].response_timeout = 0;
  server_init_arguments[7].alloc_client = alloc_dummy_client;
  server_init_arguments[7].free_client = free_dummy_client;
  server_init_arguments[7].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[7].enable_fast_open = false;
  server_init_arguments[7].expected_result = CIO_INVALID_ARGUMENT;
  server_init_arguments[8].server = &server;
  server_init_arguments[8].loop = &::loop;
  server_init_arguments[8].serve_error = serve_error;
  server_init_arguments[8].header_read_timeout = 5000000000;
  server_init_arguments[8].body_read_timeout = 5000000000;
  server_init_arguments[8].response_timeout = 5000000000;
  server_init_arguments[8].alloc_client = (_func_cio_socket_ptr *)0x0;
  server_init_arguments[8].free_client = free_dummy_client;
  server_init_arguments[8].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[8].enable_fast_open = false;
  server_init_arguments[8].expected_result = CIO_INVALID_ARGUMENT;
  server_init_arguments[9].server = &server;
  server_init_arguments[9].loop = &::loop;
  server_init_arguments[9].serve_error = serve_error;
  server_init_arguments[9].header_read_timeout = 5000000000;
  server_init_arguments[9].body_read_timeout = 5000000000;
  server_init_arguments[9].response_timeout = 5000000000;
  server_init_arguments[9].alloc_client = alloc_dummy_client;
  server_init_arguments[9].free_client = (_func_void_cio_socket_ptr *)0x0;
  server_init_arguments[9].server_socket_init = cio_server_socket_init_ok;
  server_init_arguments[9].enable_fast_open = false;
  server_init_arguments[9].expected_result = CIO_INVALID_ARGUMENT;
  server_init_arguments[10].server = &server;
  server_init_arguments[10].loop = &::loop;
  server_init_arguments[10].serve_error = serve_error;
  server_init_arguments[10].header_read_timeout = 5000000000;
  server_init_arguments[10].body_read_timeout = 5000000000;
  server_init_arguments[10].response_timeout = 5000000000;
  server_init_arguments[10].alloc_client = alloc_dummy_client;
  server_init_arguments[10].free_client = free_dummy_client;
  server_init_arguments[10].server_socket_init = cio_server_socket_init_fails;
  server_init_arguments[10].enable_fast_open = false;
  server_init_arguments[10].expected_result = CIO_INVALID_ARGUMENT;
  for (lVar4 = 0x4c; lVar4 != 0x3bc; lVar4 = lVar4 + 0x50) {
    server_00 = *(cio_http_server **)((long)auStack_5f4 + lVar4);
    loop = *(cio_eventloop **)((long)auStack_5f4 + lVar4 + 8);
    cio_server_socket_init_fake.custom_fake =
         *(_func_cio_error_cio_server_socket_ptr_cio_eventloop_ptr_uint_cio_address_family_cio_alloc_client_t_cio_free_client_t_uint64_t_cio_server_socket_close_hook_t
           **)((long)auStack_5f4 + lVar4 + 0x40);
    bVar1 = *(byte *)((long)server_init_arguments + lVar4 + -4);
    iVar2 = *(int *)((long)&server_init_arguments[0].server + lVar4);
    local_238.endpoint.impl.sa._92_8_ = 0;
    local_238.endpoint.impl.sa._100_8_ = 0;
    local_238.endpoint.impl.sa._76_8_ = 0;
    local_238.endpoint.impl.sa._84_8_ = 0;
    local_238.endpoint.impl.sa._60_8_ = 0;
    local_238.endpoint.impl.sa._68_8_ = 0;
    local_238.endpoint.impl.sa._44_8_ = 0;
    local_238.endpoint.impl.sa._52_8_ = 0;
    local_238.endpoint.impl.sa._28_8_ = 0;
    local_238.endpoint.impl.sa._36_8_ = 0;
    local_238.endpoint.impl.sa._108_4_ = 0;
    local_238.endpoint.impl.sa._12_8_ = 0;
    local_238.endpoint.impl.sa._20_8_ = 0;
    local_238.endpoint.impl._0_8_ = 0;
    local_238.endpoint.impl.sa._4_8_ = 0;
    local_238.on_error = *(cio_http_serve_on_error_t *)((long)auStack_5f4 + lVar4 + 0x10);
    local_238.read_header_timeout_ns = *(uint64_t *)((long)auStack_5f4 + lVar4 + 0x18);
    local_238.read_body_timeout_ns = *(uint64_t *)((long)auStack_5f4 + lVar4 + 0x20);
    local_238.response_timeout_ns = *(uint64_t *)((long)auStack_5f4 + lVar4 + 0x28);
    local_238.close_timeout_ns = 10;
    local_238.use_tcp_fastopen = (_Bool)(bVar1 & 1);
    local_238.alloc_client = *(cio_alloc_client_t *)((long)auStack_5f4 + lVar4 + 0x30);
    local_238.free_client = *(cio_free_client_t *)((long)auStack_5f4 + lVar4 + 0x38);
    stack0xfffffffffffffa50 = 0x106588;
    arg1 = cio_get_inet_address_any4();
    stack0xfffffffffffffa50 = 0x106598;
    cio_init_inet_socket_address(&local_238.endpoint,arg1,0x1f90);
    stack0xfffffffffffffa50 = 0x1065a6;
    cVar3 = cio_http_server_init(server_00,loop,&local_238);
    stack0xfffffffffffffa50 = 0x1065c1;
    UnityAssertEqualNumber
              ((long)iVar2,(long)cVar3,"Initialization failed!",0x3da,UNITY_DISPLAY_STYLE_INT);
    if ((bVar1 & 1) != 0) {
      stack0xfffffffffffffa50 = 0x1065e5;
      UnityAssertEqualNumber
                (1,(ulong)cio_server_socket_set_tcp_fast_open_fake.call_count,
                 "TCP FAST OPEN was not configured!",0x3dc,UNITY_DISPLAY_STYLE_INT);
    }
    stack0xfffffffffffffa50 = 0x1065fb;
    free(&client_socket[-2].impl.close_timer.impl.ev.fd);
    stack0xfffffffffffffa50 = 0x106600;
    setUp();
  }
  stack0xfffffffffffffa50 = 0x10661c;
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_server_init(void)
{
	struct server_init_arguments {
		struct cio_http_server *server;
		struct cio_eventloop *loop;
		void (*serve_error)(struct cio_http_server *server, const char *reason);
		uint64_t header_read_timeout;
		uint64_t body_read_timeout;
		uint64_t response_timeout;
		struct cio_socket *(*alloc_client)(void);
		void (*free_client)(struct cio_socket *socket);
		enum cio_error (*server_socket_init)(struct cio_server_socket *ss, struct cio_eventloop *loop, unsigned int backlog, enum cio_address_family family, cio_alloc_client_t alloc_client, cio_free_client_t free_client, uint64_t close_timeout_ns, cio_server_socket_close_hook_t close_hook);
		bool enable_fast_open;
		enum cio_error expected_result;
	};

	struct cio_http_server server;
	struct server_init_arguments server_init_arguments[] = {
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_SUCCESS},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = true, .expected_result = CIO_SUCCESS},
	    {.server = NULL, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = NULL, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = NULL, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_SUCCESS},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = 0, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = 0, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = 0, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = NULL, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = NULL, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_fails, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(server_init_arguments); i++) {
		struct server_init_arguments args = server_init_arguments[i];
		cio_server_socket_init_fake.custom_fake = args.server_socket_init;

		struct cio_http_server_configuration config = {
		    .on_error = args.serve_error,
		    .read_header_timeout_ns = args.header_read_timeout,
		    .read_body_timeout_ns = args.body_read_timeout,
		    .response_timeout_ns = args.response_timeout,
		    .close_timeout_ns = 10,
		    .use_tcp_fastopen = args.enable_fast_open,
		    .alloc_client = args.alloc_client,
		    .free_client = args.free_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		enum cio_error err = cio_http_server_init(args.server, args.loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(args.expected_result, err, "Initialization failed!");
		if (args.enable_fast_open) {
			TEST_ASSERT_EQUAL_MESSAGE(1, cio_server_socket_set_tcp_fast_open_fake.call_count, "TCP FAST OPEN was not configured!");
		}

		free_dummy_client(client_socket);
		setUp();
	}

	free_dummy_client(client_socket);
}